

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall despot::BaseTag::PrintState(BaseTag *this,State *s,ostream *out)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  
  iVar1 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[*(int *)(s + 0xc)];
  iVar2 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[*(int *)(s + 0xc)];
  uVar4 = despot::Floor::num_rows();
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
    do {
      iVar5 = despot::Floor::num_cols();
      if (0 < iVar5) {
        lVar7 = 0;
        lVar10 = 0;
        do {
          piVar6 = (int *)&Floor::INVALID;
          if ((lVar10 < (this->floor_).num_cols_) &&
             (piVar6 = (int *)&Floor::INVALID, (long)uVar9 <= (long)(this->floor_).num_rows_)) {
            piVar6 = (int *)((long)(this->floor_).floor_[uVar9 - 1] + lVar7);
          }
          iVar5 = *piVar6;
          pcVar8 = "#";
          if ((iVar5 != (int)Floor::INVALID) && ((iVar5 != iVar1 || (pcVar8 = "Q", iVar5 != iVar2)))
             ) {
            pcVar8 = "O";
            if (iVar5 != iVar2) {
              pcVar8 = ".";
            }
            if (iVar5 == iVar1) {
              pcVar8 = "R";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,1);
          lVar10 = lVar10 + 1;
          iVar5 = despot::Floor::num_cols();
          lVar7 = lVar7 + 4;
        } while (lVar10 < iVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      bVar3 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void BaseTag::PrintState(const State& s, ostream& out) const {
	const TagState& state = static_cast<const TagState&>(s);

	int aindex = rob_[state.state_id];
	int oindex = opp_[state.state_id];

	for (int y = floor_.num_rows()-1; y >= 0; y--) {
		for (int x = 0; x < floor_.num_cols(); x++) {
			int index = floor_.GetIndex(x, y);
			if (index == Floor::INVALID)
				out << "#";
			else if (index == aindex && index == oindex)
				out << "Q";
			else if (index == aindex)
				out << "R";
			else if (index == oindex)
				out << "O";
			else
				out << ".";
		}
		out << endl;
	}
}